

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

void __thiscall Assimp::IFC::TempMesh::Append(TempMesh *this,TempMesh *other)

{
  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
            ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this,
             (this->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (other->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start,
             (other->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->mVertcnt,
             (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void TempMesh::Append(const TempMesh& other)
{
    mVerts.insert(mVerts.end(),other.mVerts.begin(),other.mVerts.end());
    mVertcnt.insert(mVertcnt.end(),other.mVertcnt.begin(),other.mVertcnt.end());
}